

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

bool EV_DoDonut(int tag,line_t_conflict *line,double pillarspeed,double slimespeed)

{
  bool bVar1;
  FTextureID FVar2;
  DFloor *pDVar3;
  size_t len;
  double dVar4;
  double dVar5;
  FSectorTagIterator local_70;
  FSectorTagIterator itr;
  double height;
  vertex_t *spot;
  DFloor *floor;
  byte local_45;
  int i;
  bool rtn;
  sector_t_conflict *psStack_40;
  int secnum;
  sector_t_conflict *s3;
  sector_t_conflict *s2;
  sector_t_conflict *s1;
  double slimespeed_local;
  double pillarspeed_local;
  line_t_conflict *line_local;
  int tag_local;
  
  local_45 = 0;
  s1 = (sector_t_conflict *)slimespeed;
  slimespeed_local = pillarspeed;
  pillarspeed_local = (double)line;
  line_local._4_4_ = tag;
  FSectorTagIterator::FSectorTagIterator(&local_70,tag,line);
  do {
    do {
      do {
        do {
          i = FSectorTagIterator::Next(&local_70);
          if (i < 0) {
            return (bool)(local_45 & 1);
          }
          s2 = sectors + i;
          bVar1 = sector_t::PlaneMoving((sector_t *)s2,0);
        } while (bVar1);
        local_45 = 1;
        s3 = getNextSector(*s2->lines,s2);
      } while (s3 == (sector_t_conflict *)0x0);
      len = 0;
      bVar1 = sector_t::PlaneMoving((sector_t *)s3,0);
    } while (bVar1);
    for (floor._4_4_ = 0; floor._4_4_ < s3->linecount; floor._4_4_ = floor._4_4_ + 1) {
      if (((s3->lines[floor._4_4_]->flags & 4) != 0) && (s3->lines[floor._4_4_]->backsector != s2))
      {
        psStack_40 = s3->lines[floor._4_4_]->backsector;
        pDVar3 = (DFloor *)DObject::operator_new((DObject *)0xa0,len);
        DFloor::DFloor(pDVar3,s3);
        pDVar3->m_Type = donutRaise;
        pDVar3->m_Crush = -1;
        pDVar3->m_Hexencrush = false;
        pDVar3->m_Direction = 1;
        (pDVar3->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector = s3;
        pDVar3->m_Speed = (double)s1;
        spot = (vertex_t *)pDVar3;
        FVar2 = sector_t::GetTexture((sector_t *)psStack_40,0);
        *(int *)((long)&spot[6].p.Y + 4) = FVar2.texnum;
        secspecial_t::Clear((secspecial_t *)&spot[5].p.Y);
        itr = (FSectorTagIterator)
              sector_t::FindHighestFloorPoint((sector_t *)psStack_40,(vertex_t **)&height);
        dVar5 = height;
        dVar4 = secplane_t::PointToDist(&s3->floorplane,(vertex_t *)height,(double)itr);
        spot[7].p.X = dVar4;
        DFloor::StartFloorSound((DFloor *)spot);
        pDVar3 = (DFloor *)DObject::operator_new((DObject *)0xa0,(size_t)dVar5);
        DFloor::DFloor(pDVar3,s2);
        pDVar3->m_Type = floorLowerToNearest;
        pDVar3->m_Crush = -1;
        pDVar3->m_Hexencrush = false;
        pDVar3->m_Direction = -1;
        (pDVar3->super_DMovingFloor).super_DMover.super_DSectorEffect.m_Sector = s2;
        pDVar3->m_Speed = slimespeed_local;
        spot = (vertex_t *)pDVar3;
        itr = (FSectorTagIterator)
              sector_t::FindHighestFloorPoint((sector_t *)psStack_40,(vertex_t **)&height);
        dVar5 = secplane_t::PointToDist(&s2->floorplane,(vertex_t *)height,(double)itr);
        spot[7].p.X = dVar5;
        DFloor::StartFloorSound((DFloor *)spot);
        break;
      }
    }
  } while( true );
}

Assistant:

bool EV_DoDonut (int tag, line_t *line, double pillarspeed, double slimespeed)
{
	sector_t*			s1;
	sector_t*			s2;
	sector_t*			s3;
	int 				secnum;
	bool 				rtn;
	int 				i;
	DFloor*				floor;
	vertex_t*			spot;
	double				height;
		
	rtn = false;

	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		s1 = &sectors[secnum];					// s1 is pillar's sector

		// ALREADY MOVING?	IF SO, KEEP GOING...
		if (s1->PlaneMoving(sector_t::floor))
			continue; // safe now, because we check that tag is non-0 in the looping condition [fdari]
						
		rtn = true;
		s2 = getNextSector (s1->lines[0], s1);	// s2 is pool's sector
		if (!s2)								// note lowest numbered line around
			continue;							// pillar must be two-sided

		if (s2->PlaneMoving(sector_t::floor))
			continue;

		for (i = 0; i < s2->linecount; i++)
		{
			if (!(s2->lines[i]->flags & ML_TWOSIDED) ||
				(s2->lines[i]->backsector == s1))
				continue;
			s3 = s2->lines[i]->backsector;
			
			//	Spawn rising slime
			floor = new DFloor (s2);
			floor->m_Type = DFloor::donutRaise;
			floor->m_Crush = -1;
			floor->m_Hexencrush = false;
			floor->m_Direction = 1;
			floor->m_Sector = s2;
			floor->m_Speed = slimespeed;
			floor->m_Texture = s3->GetTexture(sector_t::floor);
			floor->m_NewSpecial.Clear();
			height = s3->FindHighestFloorPoint (&spot);
			floor->m_FloorDestDist = s2->floorplane.PointToDist (spot, height);
			floor->StartFloorSound ();
			
			//	Spawn lowering donut-hole
			floor = new DFloor (s1);
			floor->m_Type = DFloor::floorLowerToNearest;
			floor->m_Crush = -1;
			floor->m_Hexencrush = false;
			floor->m_Direction = -1;
			floor->m_Sector = s1;
			floor->m_Speed = pillarspeed;
			height = s3->FindHighestFloorPoint (&spot);
			floor->m_FloorDestDist = s1->floorplane.PointToDist (spot, height);
			floor->StartFloorSound ();
			break;
		}
	}
	return rtn;
}